

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processAttributes
          (TraverseSchema *this,DOMElement *elem,DOMElement *attElem,ComplexTypeInfo *typeInfo,
          bool isBaseAnyType)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  DefAttTypes DVar4;
  AttTypes AVar5;
  int iVar6;
  uint uVar7;
  ComplexTypeInfo *this_00;
  undefined4 *puVar8;
  undefined4 extraout_var;
  XMLSize_t XVar9;
  XercesAttGroupInfo **ppXVar10;
  XMLSize_t XVar11;
  SchemaAttDef *pSVar12;
  SchemaAttDef *pSVar13;
  XMLAttDefList *pXVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  QName *this_01;
  XMLCh *pXVar15;
  XMLCh *localPart_00;
  XMLCh *attValue;
  XMLCh *enumValues;
  DatatypeValidator *newDatatypeValidator;
  SchemaAttDef *pSVar16;
  bool local_201;
  SchemaAttDef *local_1d8;
  DefAttTypes local_1a0;
  SchemaAttDef *newAttDef;
  XMLCh *localPart;
  QName *attName;
  SchemaAttDef *attDef;
  XMLSize_t i_1;
  SchemaAttDefList *baseAttList;
  bool childWithAttributes;
  bool baseWithAttributes;
  SchemaAttDef *newWildCard;
  DefAttTypes saveDefType;
  Janitor<xercesc_4_0::SchemaAttDef> janBaseAttWildCard;
  SchemaAttDef *baseAttWildCard;
  SchemaAttDef *attGroupWildCard;
  XMLSize_t anyAttCount;
  XMLSize_t i;
  bool defAttTypeSet;
  DefAttTypes defAttType;
  Janitor<xercesc_4_0::SchemaAttDef> janCompleteWildCard;
  SchemaAttDef *completeWildCard;
  XMLSize_t attGroupListSize;
  int derivedBy;
  XMLCh *childName;
  undefined1 local_88 [8];
  ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> attGroupList;
  XercesAttGroupInfo *attGroupInfo;
  Janitor<xercesc_4_0::SchemaAttDef> janAttWildCard;
  SchemaAttDef *attWildCard;
  DOMElement *child;
  ComplexTypeInfo *baseTypeInfo;
  bool isBaseAnyType_local;
  ComplexTypeInfo *typeInfo_local;
  DOMElement *attElem_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    this_00 = ComplexTypeInfo::getBaseComplexTypeInfo(typeInfo);
    if ((this_00 != (ComplexTypeInfo *)0x0) &&
       (bVar1 = ComplexTypeInfo::getPreprocessed(this_00), bVar1)) {
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 2;
      __cxa_throw(puVar8,&ExceptionCodes::typeinfo,0);
    }
    janAttWildCard.fData = (SchemaAttDef *)0x0;
    Janitor<xercesc_4_0::SchemaAttDef>::Janitor
              ((Janitor<xercesc_4_0::SchemaAttDef> *)&attGroupInfo,(SchemaAttDef *)0x0);
    attGroupList.fMemoryManager = (MemoryManager *)0x0;
    ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::ValueVectorOf
              ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88,4,
               this->fGrammarPoolMemoryManager,false);
    for (attWildCard = (SchemaAttDef *)attElem; attWildCard != (SchemaAttDef *)0x0;
        attWildCard = (SchemaAttDef *)XUtil::getNextSiblingElement((DOMNode *)attWildCard)) {
      iVar3 = (*(attWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[0x18])();
      pXVar15 = (XMLCh *)CONCAT44(extraout_var,iVar3);
      bVar1 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE);
      if (bVar1) {
        if (janAttWildCard.fData != (SchemaAttDef *)0x0) {
          reportSchemaError(this,(DOMElement *)attWildCard,(XMLCh *)XMLUni::fgXMLErrDomain,0x99);
        }
        traverseAttributeDecl(this,(DOMElement *)attWildCard,typeInfo,false);
      }
      else {
        bVar1 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        if (bVar1) {
          if (janAttWildCard.fData != (SchemaAttDef *)0x0) {
            reportSchemaError(this,(DOMElement *)attWildCard,(XMLCh *)XMLUni::fgXMLErrDomain,0x99);
          }
          attGroupList.fMemoryManager =
               (MemoryManager *)
               traverseAttributeGroupDecl(this,(DOMElement *)attWildCard,typeInfo,false);
          if (((XercesAttGroupInfo *)attGroupList.fMemoryManager != (XercesAttGroupInfo *)0x0) &&
             (bVar1 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::containsElement
                                ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88,
                                 (XercesAttGroupInfo **)&attGroupList.fMemoryManager,0), !bVar1)) {
            ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::addElement
                      ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88,
                       (XercesAttGroupInfo **)&attGroupList.fMemoryManager);
          }
        }
        else {
          bVar1 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgELT_ANYATTRIBUTE);
          if (bVar1) {
            if (janAttWildCard.fData != (SchemaAttDef *)0x0) {
              reportSchemaError(this,(DOMElement *)attWildCard,(XMLCh *)XMLUni::fgXMLErrDomain,0x98)
              ;
            }
            janAttWildCard.fData = traverseAnyAttribute(this,attWildCard);
            Janitor<xercesc_4_0::SchemaAttDef>::reset
                      ((Janitor<xercesc_4_0::SchemaAttDef> *)&attGroupInfo,janAttWildCard.fData);
          }
          else {
            reportSchemaError(this,(DOMElement *)attWildCard,(XMLCh *)XMLUni::fgXMLErrDomain,0x2a,
                              pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
    }
    iVar3 = ComplexTypeInfo::getDerivedBy(typeInfo);
    XVar9 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::size
                      ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88);
    if (XVar9 != 0) {
      janCompleteWildCard.fData = (SchemaAttDef *)0x0;
      Janitor<xercesc_4_0::SchemaAttDef>::Janitor
                ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff40,(SchemaAttDef *)0x0)
      ;
      i._4_4_ = DefAttTypes_Min;
      bVar1 = false;
      for (anyAttCount = 0; anyAttCount < XVar9; anyAttCount = anyAttCount + 1) {
        ppXVar10 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::elementAt
                             ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88,
                              anyAttCount);
        attGroupList.fMemoryManager = (MemoryManager *)*ppXVar10;
        XVar11 = XercesAttGroupInfo::anyAttributeCount
                           ((XercesAttGroupInfo *)attGroupList.fMemoryManager);
        if (XVar11 != 0) {
          if (!bVar1) {
            if (janAttWildCard.fData == (SchemaAttDef *)0x0) {
              pSVar12 = XercesAttGroupInfo::anyAttributeAt
                                  ((XercesAttGroupInfo *)attGroupList.fMemoryManager,0);
              local_1a0 = XMLAttDef::getDefaultType(&pSVar12->super_XMLAttDef);
            }
            else {
              local_1a0 = XMLAttDef::getDefaultType(&(janAttWildCard.fData)->super_XMLAttDef);
            }
            i._4_4_ = local_1a0;
            bVar1 = true;
          }
          pSVar12 = XercesAttGroupInfo::getCompleteWildCard
                              ((XercesAttGroupInfo *)attGroupList.fMemoryManager);
          if (janCompleteWildCard.fData == (SchemaAttDef *)0x0) {
            pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef(pSVar13,pSVar12);
            janCompleteWildCard.fData = pSVar13;
            Janitor<xercesc_4_0::SchemaAttDef>::reset
                      ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff40,pSVar13);
          }
          else {
            attWildCardIntersection(this,janCompleteWildCard.fData,pSVar12);
          }
        }
      }
      if (janCompleteWildCard.fData != (SchemaAttDef *)0x0) {
        if (janAttWildCard.fData == (SchemaAttDef *)0x0) {
          janAttWildCard = janCompleteWildCard;
          Janitor<xercesc_4_0::SchemaAttDef>::orphan
                    ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff40);
          Janitor<xercesc_4_0::SchemaAttDef>::reset
                    ((Janitor<xercesc_4_0::SchemaAttDef> *)&attGroupInfo,janAttWildCard.fData);
        }
        else {
          attWildCardIntersection(this,janAttWildCard.fData,janCompleteWildCard.fData);
        }
        XMLAttDef::setDefaultType(&(janAttWildCard.fData)->super_XMLAttDef,i._4_4_);
      }
      Janitor<xercesc_4_0::SchemaAttDef>::~Janitor
                ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff40);
    }
    if (this_00 == (ComplexTypeInfo *)0x0) {
      local_1d8 = (SchemaAttDef *)0x0;
    }
    else {
      local_1d8 = ComplexTypeInfo::getAttWildCard(this_00);
    }
    janBaseAttWildCard.fData = local_1d8;
    Janitor<xercesc_4_0::SchemaAttDef>::Janitor
              ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff10,(SchemaAttDef *)0x0);
    if (iVar3 == 2) {
      if (isBaseAnyType) {
        pSVar12 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef
                  (pSVar12,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                   this->fGrammarPoolMemoryManager);
        janBaseAttWildCard.fData = pSVar12;
        Janitor<xercesc_4_0::SchemaAttDef>::reset
                  ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff10,pSVar12);
      }
      if ((janBaseAttWildCard.fData != (SchemaAttDef *)0x0) &&
         (janAttWildCard.fData != (SchemaAttDef *)0x0)) {
        DVar4 = XMLAttDef::getDefaultType(&(janAttWildCard.fData)->super_XMLAttDef);
        attWildCardUnion(this,janAttWildCard.fData,janBaseAttWildCard.fData);
        XMLAttDef::setDefaultType(&(janAttWildCard.fData)->super_XMLAttDef,DVar4);
      }
    }
    if (janAttWildCard.fData == (SchemaAttDef *)0x0) {
      if ((janBaseAttWildCard.fData != (SchemaAttDef *)0x0) && (iVar3 == 2)) {
        if (isBaseAnyType) {
          ComplexTypeInfo::setAttWildCard(typeInfo,janBaseAttWildCard.fData);
          Janitor<xercesc_4_0::SchemaAttDef>::orphan
                    ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff10);
        }
        else {
          pSVar12 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef(pSVar12,janBaseAttWildCard.fData);
          ComplexTypeInfo::setAttWildCard(typeInfo,pSVar12);
        }
      }
    }
    else {
      ComplexTypeInfo::setAttWildCard(typeInfo,janAttWildCard.fData);
      Janitor<xercesc_4_0::SchemaAttDef>::orphan
                ((Janitor<xercesc_4_0::SchemaAttDef> *)&attGroupInfo);
      AVar5 = XMLAttDef::getType(&(janAttWildCard.fData)->super_XMLAttDef);
      if (AVar5 == AttTypes_Unknown) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6c);
      }
    }
    local_201 = false;
    if (this_00 != (ComplexTypeInfo *)0x0) {
      local_201 = ComplexTypeInfo::hasAttDefs(this_00);
    }
    bVar2 = ComplexTypeInfo::hasAttDefs(typeInfo);
    bVar1 = true;
    if (!bVar2) {
      pSVar12 = ComplexTypeInfo::getAttWildCard(typeInfo);
      bVar1 = pSVar12 != (SchemaAttDef *)0x0;
    }
    if ((iVar3 == 4) && (bVar1)) {
      if ((local_201 == false) && (janBaseAttWildCard.fData == (SchemaAttDef *)0x0)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6d);
      }
      else {
        checkAttDerivationOK(this,elem,this_00,typeInfo);
      }
    }
    if ((this_00 != (ComplexTypeInfo *)0x0) && (bVar1 = ComplexTypeInfo::hasAttDefs(this_00), bVar1)
       ) {
      pXVar14 = ComplexTypeInfo::getAttDefList(this_00);
      for (attDef = (SchemaAttDef *)0x0;
          iVar6 = (*(pXVar14->super_XSerializable)._vptr_XSerializable[10])(),
          attDef < (SchemaAttDef *)CONCAT44(extraout_var_00,iVar6);
          attDef = (SchemaAttDef *)
                   ((long)&(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1)) {
        iVar6 = (*(pXVar14->super_XSerializable)._vptr_XSerializable[0xb])(pXVar14,attDef);
        pSVar12 = (SchemaAttDef *)CONCAT44(extraout_var_01,iVar6);
        this_01 = SchemaAttDef::getAttName(pSVar12);
        pXVar15 = QName::getLocalPart(this_01);
        uVar7 = QName::getURI(this_01);
        pSVar13 = ComplexTypeInfo::getAttDef(typeInfo,pXVar15,uVar7);
        if (pSVar13 == (SchemaAttDef *)0x0) {
          DVar4 = XMLAttDef::getDefaultType((XMLAttDef *)pSVar12);
          if (DVar4 != DefAttTypes_Max) {
            pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            pXVar15 = QName::getPrefix(this_01);
            localPart_00 = QName::getLocalPart(this_01);
            uVar7 = QName::getURI(this_01);
            attValue = XMLAttDef::getValue((XMLAttDef *)pSVar12);
            AVar5 = XMLAttDef::getType((XMLAttDef *)pSVar12);
            DVar4 = XMLAttDef::getDefaultType((XMLAttDef *)pSVar12);
            enumValues = XMLAttDef::getEnumeration((XMLAttDef *)pSVar12);
            SchemaAttDef::SchemaAttDef
                      (pSVar13,pXVar15,localPart_00,uVar7,attValue,AVar5,DVar4,enumValues,
                       this->fGrammarPoolMemoryManager);
            newDatatypeValidator = SchemaAttDef::getDatatypeValidator(pSVar12);
            SchemaAttDef::setDatatypeValidator(pSVar13,newDatatypeValidator);
            ComplexTypeInfo::addAttDef(typeInfo,pSVar13);
            pSVar16 = SchemaAttDef::getBaseAttDecl(pSVar12);
            if (pSVar16 == (SchemaAttDef *)0x0) {
              SchemaAttDef::setBaseAttDecl(pSVar13,pSVar12);
            }
            else {
              pSVar12 = SchemaAttDef::getBaseAttDecl(pSVar12);
              SchemaAttDef::setBaseAttDecl(pSVar13,pSVar12);
            }
          }
        }
        else if (iVar3 == 2) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6b,pXVar15,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
    Janitor<xercesc_4_0::SchemaAttDef>::~Janitor
              ((Janitor<xercesc_4_0::SchemaAttDef> *)&stack0xffffffffffffff10);
    ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::~ValueVectorOf
              ((ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> *)local_88);
    Janitor<xercesc_4_0::SchemaAttDef>::~Janitor
              ((Janitor<xercesc_4_0::SchemaAttDef> *)&attGroupInfo);
  }
  return;
}

Assistant:

void TraverseSchema::processAttributes(const DOMElement* const elem,
                                       const DOMElement* const attElem,
                                       ComplexTypeInfo* const typeInfo,
                                       const bool isBaseAnyType) {

    // If we do not have a complexTypeInfo, then what is the point of
    // processing.
    if (typeInfo == 0) {
        return;
    }

    ComplexTypeInfo* baseTypeInfo = typeInfo->getBaseComplexTypeInfo();
    if (baseTypeInfo && baseTypeInfo->getPreprocessed())
        throw TraverseSchema::RecursingElement;

    const DOMElement* child = attElem;
    SchemaAttDef* attWildCard = 0;
    Janitor<SchemaAttDef> janAttWildCard(0);
    XercesAttGroupInfo* attGroupInfo = 0;
    ValueVectorOf<XercesAttGroupInfo*> attGroupList(4, fGrammarPoolMemoryManager);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTE)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            traverseAttributeDecl(child, typeInfo);
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            attGroupInfo = traverseAttributeGroupDecl(child, typeInfo);
            if (attGroupInfo && !attGroupList.containsElement(attGroupInfo)) {
                attGroupList.addElement(attGroupInfo);
            }
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ANYATTRIBUTE) ) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAnyAttribute);

            attWildCard = traverseAnyAttribute(child);
            janAttWildCard.reset(attWildCard);
        }
        else {
            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildInComplexType, childName);
        }
    }

    // -------------------------------------------------------------
    // Handle wild card/any attribute
    // -------------------------------------------------------------
    int derivedBy = typeInfo->getDerivedBy();
    XMLSize_t attGroupListSize = attGroupList.size();

    if (attGroupListSize) {

        SchemaAttDef* completeWildCard = 0;
        Janitor<SchemaAttDef> janCompleteWildCard(0);
        XMLAttDef::DefAttTypes defAttType = XMLAttDef::Default;
        bool defAttTypeSet = false;

        for (XMLSize_t i=0; i < attGroupListSize; i++) {

            attGroupInfo = attGroupList.elementAt(i);
            XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();

            if (anyAttCount) {

                if (!defAttTypeSet) {

                    defAttType = (attWildCard) ? attWildCard->getDefaultType()
                                               : attGroupInfo->anyAttributeAt(0)->getDefaultType();
                    defAttTypeSet = true;
                }

                SchemaAttDef* attGroupWildCard = attGroupInfo->getCompleteWildCard();
                if (completeWildCard) {
                    attWildCardIntersection(completeWildCard, attGroupWildCard);
                }
                else {
                    completeWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(attGroupWildCard);
                    janCompleteWildCard.reset(completeWildCard);
                }
            }

        }

        if (completeWildCard) {

            if (attWildCard) {
                attWildCardIntersection(attWildCard, completeWildCard);
            }
            else {

                attWildCard = completeWildCard;
                janCompleteWildCard.orphan();
                janAttWildCard.reset(attWildCard);
            }

            attWildCard->setDefaultType(defAttType);
        }
    }

    SchemaAttDef* baseAttWildCard = (baseTypeInfo) ? baseTypeInfo->getAttWildCard() : 0;
    Janitor<SchemaAttDef> janBaseAttWildCard(0);

    if (derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            baseAttWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                               XMLUni::fgZeroLenString,
                                               fEmptyNamespaceURI, XMLAttDef::Any_Any,
                                               XMLAttDef::ProcessContents_Lax,
                                               fGrammarPoolMemoryManager);
            janBaseAttWildCard.reset(baseAttWildCard);
        }

        if (baseAttWildCard && attWildCard) {

            XMLAttDef::DefAttTypes saveDefType = attWildCard->getDefaultType();
            attWildCardUnion(attWildCard, baseAttWildCard);
            attWildCard->setDefaultType(saveDefType);
        }
    }

    // -------------------------------------------------------------
    // insert wildcard attribute
    // -------------------------------------------------------------
    if (attWildCard) {

        typeInfo->setAttWildCard(attWildCard);
        janAttWildCard.orphan();

        if (attWildCard->getType() == XMLAttDef::AttTypes_Unknown) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotExpressibleWildCardIntersection);
        }
    }
    else if (baseAttWildCard && derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            typeInfo->setAttWildCard(baseAttWildCard);
            janBaseAttWildCard.orphan();
        }
        else {

            SchemaAttDef* newWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(baseAttWildCard);
            typeInfo->setAttWildCard(newWildCard);
        }
    }

    // -------------------------------------------------------------
    // Check attributes derivation OK
    // -------------------------------------------------------------
    bool baseWithAttributes = (baseTypeInfo && baseTypeInfo->hasAttDefs());
    bool childWithAttributes = (typeInfo->hasAttDefs() || typeInfo->getAttWildCard());

    if (derivedBy == SchemaSymbols::XSD_RESTRICTION && childWithAttributes) {

        if (!baseWithAttributes && !baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
        }
        else {
            checkAttDerivationOK(elem, baseTypeInfo, typeInfo);
        }
    }

    // -------------------------------------------------------------
    // merge in base type's attribute decls
    // -------------------------------------------------------------
    if (baseTypeInfo && baseTypeInfo->hasAttDefs()) {

        SchemaAttDefList& baseAttList = (SchemaAttDefList&)
                                        baseTypeInfo->getAttDefList();

        for (XMLSize_t i=0; i<baseAttList.getAttDefCount(); i++) {

            SchemaAttDef& attDef = (SchemaAttDef&) baseAttList.getAttDef(i);
            QName* attName = attDef.getAttName();
            const XMLCh* localPart = attName->getLocalPart();

            // if found a duplicate, then skip the one from the base type
            if (typeInfo->getAttDef(localPart, attName->getURI()) != 0) {

                if (derivedBy == SchemaSymbols::XSD_EXTENSION) {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttInDerivation, localPart);
                }

                continue;
            }

            if (attDef.getDefaultType() != XMLAttDef::Prohibited) {

                SchemaAttDef* newAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attName->getPrefix(),
                                                           attName->getLocalPart(),
                                                           attName->getURI(),
                                                           attDef.getValue(),
                                                           attDef.getType(),
                                                           attDef.getDefaultType(),
                                                           attDef.getEnumeration(),
                                                           fGrammarPoolMemoryManager);

                newAttDef->setDatatypeValidator(attDef.getDatatypeValidator());
                typeInfo->addAttDef(newAttDef);

                if (attDef.getBaseAttDecl())
                    newAttDef->setBaseAttDecl(attDef.getBaseAttDecl());
                else
                    newAttDef->setBaseAttDecl(&attDef);
            }
        }
    }
}